

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHandlerCommand.cxx
# Opt level: O2

void __thiscall cmCTestHandlerCommand::cmCTestHandlerCommand(cmCTestHandlerCommand *this)

{
  long lVar1;
  bool bVar2;
  char *local_28;
  
  (this->super_cmCTestCommand).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (this->super_cmCTestCommand).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(this->super_cmCTestCommand).super_cmCommand.Error.field_2;
  (this->super_cmCTestCommand).super_cmCommand.Error._M_string_length = 0;
  (this->super_cmCTestCommand).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (this->super_cmCTestCommand).CTest = (cmCTest *)0x0;
  (this->super_cmCTestCommand).CTestScriptHandler = (cmCTestScriptHandler *)0x0;
  (this->super_cmCTestCommand).super_cmCommand._vptr_cmCommand =
       (_func_int **)&PTR__cmCTestHandlerCommand_005e2118;
  (this->ReturnVariable)._M_dataplus._M_p = (pointer)&(this->ReturnVariable).field_2;
  (this->ReturnVariable)._M_string_length = 0;
  (this->ReturnVariable).field_2._M_local_buf[0] = '\0';
  (this->Arguments).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Arguments).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Arguments).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Values).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Values).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Values).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar1 = 100;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::reserve(&this->Arguments,100);
  while (bVar2 = lVar1 != 0, lVar1 = lVar1 + -1, bVar2) {
    local_28 = (char *)0x0;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&this->Arguments,&local_28);
  }
  (this->Arguments).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start[1] = "RETURN_VALUE";
  (this->Arguments).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start[2] = "CAPTURE_CMAKE_ERROR";
  (this->Arguments).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start[4] = "SOURCE";
  (this->Arguments).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start[3] = "BUILD";
  (this->Arguments).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start[5] = "SUBMIT_INDEX";
  this->Last = 6;
  this->AppendXML = false;
  this->Quiet = false;
  return;
}

Assistant:

cmCTestHandlerCommand::cmCTestHandlerCommand()
{
  const size_t INIT_SIZE = 100;
  size_t cc;
  this->Arguments.reserve(INIT_SIZE);
  for (cc = 0; cc < INIT_SIZE; ++cc) {
    this->Arguments.push_back(nullptr);
  }
  this->Arguments[ct_RETURN_VALUE] = "RETURN_VALUE";
  this->Arguments[ct_CAPTURE_CMAKE_ERROR] = "CAPTURE_CMAKE_ERROR";
  this->Arguments[ct_SOURCE] = "SOURCE";
  this->Arguments[ct_BUILD] = "BUILD";
  this->Arguments[ct_SUBMIT_INDEX] = "SUBMIT_INDEX";
  this->Last = ct_LAST;
  this->AppendXML = false;
  this->Quiet = false;
}